

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<false,false,true,false>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  byte bVar1;
  SVOBitset *pSVar2;
  uint g;
  uint g_00;
  
  bVar1 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,current_assignment->pattern_vertex,d->v);
  if ((bVar1 & 1) == 0) {
    pSVar2 = HomomorphismModel::target_graph_row(this->model,0,current_assignment->target_vertex);
    SVOBitset::intersect_with_complement(&d->values,pSVar2);
  }
  else {
    pSVar2 = HomomorphismModel::target_graph_row(this->model,0,current_assignment->target_vertex);
    SVOBitset::operator&=(&d->values,pSVar2);
  }
  g_00 = 1;
  while( true ) {
    if (this->model->max_graphs <= g_00) break;
    if ((bVar1 >> (g_00 & 0x1f) & 1) != 0) {
      pSVar2 = HomomorphismModel::target_graph_row
                         (this->model,g_00,current_assignment->target_vertex);
      SVOBitset::operator&=(&d->values,pSVar2);
    }
    g_00 = g_00 + 1;
  }
  return;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}